

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf-tool.cc
# Opt level: O0

int main(int argc,char **argv)

{
  uint abbrev;
  bool bVar1;
  char *pcVar2;
  typed_value<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_char>
  *ptVar3;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar4;
  typed_value<unsigned_int,_char> *ptVar5;
  basic_command_line_parser<char> *pbVar6;
  size_type sVar7;
  ostream *this;
  variable_value *pvVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  uint *puVar10;
  bool local_3f9;
  allocator local_371;
  string local_370;
  reference local_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *i;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  sha sha;
  allocator local_2c1;
  uint minlen;
  undefined1 local_2a0 [8];
  map map;
  char usage_banner [52];
  allocator local_219;
  key_type local_218;
  undefined4 local_1f8;
  allocator local_1f1;
  key_type local_1f0;
  basic_command_line_parser<char> local_1d0;
  basic_parsed_options<char> local_158;
  positional_options_description local_130 [8];
  positional_options_description popt;
  uint local_f4;
  undefined8 local_f0 [3];
  allocator local_d1;
  string local_d0 [32];
  options_description local_b0 [8];
  options_description optdesc;
  undefined1 local_30 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  input;
  char **argv_local;
  int argc_local;
  
  input.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)argv;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_d0,
             "sshash-elf -- tool for processing sshash stings in ELF files\nUsage: sshash-elf <--hashmap map> [options] [elf-input-files]\nOptions"
             ,&local_d1);
  boost::program_options::options_description::options_description
            (local_b0,local_d0,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  local_f0[0] = boost::program_options::options_description::add_options();
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)local_f0,"help");
  ptVar3 = boost::program_options::
           value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                     ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_30);
  ptVar3 = boost::program_options::
           typed_value<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_char>
           ::composing(ptVar3);
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)"input",(char *)ptVar3);
  ptVar4 = boost::program_options::value<std::__cxx11::string>();
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)"hashmap,m",(char *)ptVar4);
  ptVar5 = boost::program_options::value<unsigned_int>();
  local_f4 = 8;
  ptVar5 = boost::program_options::typed_value<unsigned_int,_char>::default_value(ptVar5,&local_f4);
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)"minlen,L",(char *)ptVar5);
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,"dryrun");
  boost::program_options::options_description_easy_init::operator()(pcVar2,"verbose");
  boost::program_options::positional_options_description::positional_options_description(local_130);
  boost::program_options::positional_options_description::add((char *)local_130,0x1310af);
  boost::program_options::basic_command_line_parser<char>::basic_command_line_parser
            (&local_1d0,argc,
             (char **)input.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pbVar6 = boost::program_options::basic_command_line_parser<char>::options(&local_1d0,local_b0);
  pbVar6 = boost::program_options::basic_command_line_parser<char>::positional(pbVar6,local_130);
  boost::program_options::basic_command_line_parser<char>::run(&local_158,pbVar6);
  boost::program_options::store((basic_parsed_options *)&local_158,(variables_map *)optmap,false);
  boost::program_options::basic_parsed_options<char>::~basic_parsed_options(&local_158);
  boost::program_options::basic_command_line_parser<char>::~basic_command_line_parser(&local_1d0);
  boost::program_options::notify((variables_map *)optmap);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1f0,"help",&local_1f1);
  sVar7 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                   *)(optmap + 0x10),&local_1f0);
  local_3f9 = true;
  if (sVar7 == 0) {
    local_3f9 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_30);
  }
  std::__cxx11::string::~string((string *)&local_1f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
  if (local_3f9 == false) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_218,"verbose",&local_219);
    sVar7 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                     *)(optmap + 0x10),&local_218);
    opt_verbose = sVar7 != 0;
    std::__cxx11::string::~string((string *)&local_218);
    std::allocator<char>::~allocator((allocator<char> *)&local_219);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(usage_banner + 0x30),"dryrun",(allocator *)(usage_banner + 0x2f));
    sVar7 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                     *)(optmap + 0x10),(key_type *)(usage_banner + 0x30));
    opt_dryrun = sVar7 != 0;
    std::__cxx11::string::~string((string *)(usage_banner + 0x30));
    std::allocator<char>::~allocator((allocator<char> *)(usage_banner + 0x2f));
    memcpy(&map.super_ptree.m_children,"usage: sshash-tool [<elf_file>] [<ssiMapFilename>]\n",0x34);
    if (argc < 3) {
      std::operator<<((ostream *)&std::cerr,(char *)&map.super_ptree.m_children);
      argv_local._4_4_ = -1;
      local_1f8 = 1;
    }
    else {
      sshash::map::map((map *)local_2a0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&minlen,"hashmap",&local_2c1);
      pvVar8 = boost::program_options::variables_map::operator[]
                         ((variables_map *)optmap,(string *)&minlen);
      pbVar9 = boost::program_options::variable_value::as<std::__cxx11::string>(pvVar8);
      sshash::map::load((map *)local_2a0,pbVar9,true);
      std::__cxx11::string::~string((string *)&minlen);
      std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(sha._map + 0x3c),"minlen",(allocator *)(sha._map + 0x3b));
      pvVar8 = boost::program_options::variables_map::operator[]
                         ((variables_map *)optmap,(string *)(sha._map + 0x3c));
      puVar10 = boost::program_options::variable_value::as<unsigned_int>(pvVar8);
      abbrev = *puVar10;
      std::__cxx11::string::~string((string *)(sha._map + 0x3c));
      std::allocator<char>::~allocator((allocator<char> *)(sha._map + 0x3b));
      sshash::sha::sha((sha *)&__range1,abbrev);
      __end1 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_30);
      i = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_30);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&i), bVar1) {
        local_350 = __gnu_cxx::
                    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&__end1);
        bVar1 = elf_process((map *)local_2a0,(sha *)&__range1,local_350);
        if (!bVar1) break;
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end1);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_370,"hashmap",&local_371);
      pvVar8 = boost::program_options::variables_map::operator[]((variables_map *)optmap,&local_370)
      ;
      pbVar9 = boost::program_options::variable_value::as<std::__cxx11::string>(pvVar8);
      sshash::map::save((map *)local_2a0,pbVar9);
      std::__cxx11::string::~string((string *)&local_370);
      std::allocator<char>::~allocator((allocator<char> *)&local_371);
      argv_local._4_4_ = 0;
      local_1f8 = 1;
      sshash::map::~map((map *)local_2a0);
    }
  }
  else {
    this = (ostream *)boost::program_options::operator<<((ostream *)&std::cout,local_b0);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    argv_local._4_4_ = 1;
    local_1f8 = 1;
  }
  boost::program_options::positional_options_description::~positional_options_description(local_130)
  ;
  boost::program_options::options_description::~options_description(local_b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_30);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char* argv[])
{
	std::vector<std::string> input;

	// **** Parse command line arguments ****
	po::options_description optdesc("sshash-elf -- tool for processing sshash stings in ELF files\n"
				"Usage: sshash-elf <--hashmap map> [options] [elf-input-files]\n"
				"Options");
	optdesc.add_options()
		("help", "Print this message")
		("input",     po::value<std::vector<std::string> >(&input)->composing(), "Input ELF file. Multiple files can be specified.")
		("hashmap,m", po::value<std::string>(), "Output hasmap file.")
		("minlen,L",  po::value<unsigned int>()->default_value(8), "Length of the hash value (aka min string length)")
		("dryrun",    "Generate hashmap file but do not modify input files")
		("verbose",   "Show verbose info (digest values, etc)");

	po::positional_options_description popt;
	popt.add("input", -1);

	po::store(po::command_line_parser(argc, argv).
	          options(optdesc).positional(popt).run(), optmap);

	po::notify(optmap);

	// ** All argument values (including the defaults) are now storred in 'optmap' **

	if (optmap.count("help") || input.empty()) {
		std::cout << optdesc << std::endl;
		return 1;
	}

	opt_verbose = optmap.count("verbose");
	opt_dryrun  = optmap.count("dryrun");

	char usage_banner[] = "usage: sshash-tool [<elf_file>] [<ssiMapFilename>]\n";
	if(argc < 3) {
		std::cerr << usage_banner;
		return -1;
	}

	sshash::map map;

	// Load map.
	// This may fail if the map doesn't exist yet.
	map.load(optmap["hashmap"].as<std::string>(), true /* optional */);

	// Init hash generator
	const unsigned int minlen = optmap["minlen"].as<unsigned int>();
	sshash::sha sha(minlen);

	// Process all inputs
	for (auto &i : input) {
		if (!elf_process(map, sha, i))
			break;
	}

	// Save updated map
	map.save(optmap["hashmap"].as<std::string>());
	return 0;
}